

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O1

uint16_t __thiscall snmalloc::LocalEntropy::next_fresh_bits(LocalEntropy *this,size_t n)

{
  ulong uVar1;
  int iVar2;
  
  if (this->count <= n) {
    uVar1 = this->local_counter + 1;
    this->local_counter = uVar1;
    iVar2 = 1;
    do {
      uVar1 = ((uVar1 & 0xfffffffff) * this->local_key ^ uVar1) >> 0x20 | uVar1 << 0x20;
      iVar2 = iVar2 + -1;
    } while (iVar2 == 0);
    this->fresh_bits = uVar1;
    this->count = 0x40;
  }
  uVar1 = this->fresh_bits;
  this->fresh_bits = uVar1 >> ((byte)n & 0x3f);
  this->count = this->count - n;
  return ~(ushort)(-1L << ((byte)n & 0x3f)) & (ushort)uVar1;
}

Assistant:

uint16_t next_fresh_bits(size_t n)
    {
      if (count <= n)
      {
        fresh_bits = get_next();
        count = 64;
      }
      uint16_t result = static_cast<uint16_t>(fresh_bits & bits::mask_bits(n));
      fresh_bits >>= n;
      count -= n;
      return result;
    }